

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpressionGenerator.cpp
# Opt level: O1

void __thiscall rsg::ExpressionGenerator::generate(ExpressionGenerator *this,Expression *root)

{
  pointer *pppEVar1;
  int *piVar2;
  iterator iVar3;
  int iVar4;
  pointer ppEVar5;
  undefined4 extraout_var;
  Expression *child;
  Expression *local_28;
  Expression *local_20;
  
  iVar3._M_current =
       (this->m_expressionStack).
       super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = root;
  if (iVar3._M_current ==
      (this->m_expressionStack).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<rsg::Expression*,std::allocator<rsg::Expression*>>::
    _M_realloc_insert<rsg::Expression*const&>
              ((vector<rsg::Expression*,std::allocator<rsg::Expression*>> *)&this->m_expressionStack
               ,iVar3,&local_20);
  }
  else {
    *iVar3._M_current = root;
    pppEVar1 = &(this->m_expressionStack).
                super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  piVar2 = &this->m_state->m_expressionDepth;
  *piVar2 = *piVar2 + 1;
  ppEVar5 = (this->m_expressionStack).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_expressionStack).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppEVar5) {
    do {
      iVar4 = (*ppEVar5[-1]->_vptr_Expression[2])(ppEVar5[-1],this->m_state);
      local_28 = (Expression *)CONCAT44(extraout_var,iVar4);
      iVar3._M_current =
           (this->m_expressionStack).
           super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (local_28 == (Expression *)0x0) {
        (this->m_expressionStack).
        super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + -1;
        iVar4 = -1;
      }
      else {
        if (iVar3._M_current ==
            (this->m_expressionStack).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<rsg::Expression*,std::allocator<rsg::Expression*>>::
          _M_realloc_insert<rsg::Expression*const&>
                    ((vector<rsg::Expression*,std::allocator<rsg::Expression*>> *)
                     &this->m_expressionStack,iVar3,&local_28);
        }
        else {
          *iVar3._M_current = local_28;
          pppEVar1 = &(this->m_expressionStack).
                      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        iVar4 = 1;
      }
      piVar2 = &this->m_state->m_expressionDepth;
      *piVar2 = *piVar2 + iVar4;
      ppEVar5 = (this->m_expressionStack).
                super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while ((this->m_expressionStack).
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start != ppEVar5);
  }
  return;
}

Assistant:

void ExpressionGenerator::generate (Expression* root)
{
	DE_ASSERT(m_expressionStack.empty());

	// Initialize stack
	m_expressionStack.push_back(root);
	m_state.setExpressionDepth(m_state.getExpressionDepth()+1);

	// Process until done
	while (!m_expressionStack.empty())
	{
		DE_ASSERT(m_state.getExpressionDepth() <= m_state.getShaderParameters().maxExpressionDepth);

		Expression* curExpr = m_expressionStack[m_expressionStack.size()-1];
		Expression*	child	= curExpr->createNextChild(m_state);

		if (child)
		{
			m_expressionStack.push_back(child);
			m_state.setExpressionDepth(m_state.getExpressionDepth()+1);
		}
		else
		{
			m_expressionStack.pop_back();
			m_state.setExpressionDepth(m_state.getExpressionDepth()-1);
		}
	}
}